

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *this;
  XMLRefInfo *valueToAdopt;
  XMLSize_t *__nbytes;
  void *__buf;
  ulong uVar3;
  XMLCh *key;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  XMLSize_t dummyDataLen;
  XMLSize_t dummyBufferLen;
  XMLCh *local_58;
  XMLSize_t local_50;
  XMLSize_t local_48;
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&local_48);
    if (*objToLoad == (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this->fMemoryManager = pMVar2;
      this->fAdoptedElems = toAdopt;
      this->fBucketList = (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> **)0x0;
      this->fHashModulus = local_48;
      this->fInitialModulus = local_48;
      this->fCount = 0;
      RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::initialize(this,local_48);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_50 = 0;
    XSerializeEngine::readSize(serEng,&local_50);
    if (local_50 != 0) {
      uVar3 = 0;
      do {
        __nbytes = &local_40;
        XSerializeEngine::readString(serEng,&local_58,&local_38,&local_40,false);
        valueToAdopt = (XMLRefInfo *)XSerializeEngine::read(serEng,0x445630,__buf,(size_t)__nbytes);
        RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
                  (*objToLoad,local_58,valueToAdopt);
        uVar3 = uVar3 + 1;
      } while (uVar3 < local_50);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<XMLRefInfo>** objToLoad
                                   , int
                                   , bool                         toAdopt
                                   , XSerializeEngine&            serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<XMLRefInfo>(
                                                        hashModulus
                                                      , toAdopt
                                                      , serEng.getMemoryManager()
                                                      );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XMLCh*      key;
            serEng.readString(key);

            XMLRefInfo*  data;
            serEng>>data;

            (*objToLoad)->put((void*)key, data);
        }
    }
}